

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::AddressTest_AddressNegativeTests_InvalidIpv4Address_Test::TestBody
          (AddressTest_AddressNegativeTests_InvalidIpv4Address_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_180;
  AssertHelper local_160;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d0;
  Message local_c8;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  Message local_a0;
  ErrorCode local_98 [5];
  allocator local_81;
  string local_80;
  Error local_60;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Address addr;
  AddressTest_AddressNegativeTests_InvalidIpv4Address_Test *this_local;
  
  Address::Address((Address *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"127.0.0.1.2",&local_81);
  Address::Set(&local_60,(Address *)&gtest_ar.message_,&local_80);
  local_98[0] = kInvalidArgs;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_38,"addr.Set(\"127.0.0.1.2\")","ErrorCode::kInvalidArgs",&local_60,
             local_98);
  Error::~Error(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  bVar1 = Address::IsValid((Address *)&gtest_ar.message_);
  local_b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b8,
               (AssertionResult *)"addr.IsValid()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  bVar1 = Address::IsIpv4((Address *)&gtest_ar.message_);
  local_101 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_100,
               (AssertionResult *)"addr.IsIpv4()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  bVar1 = Address::IsIpv6((Address *)&gtest_ar.message_);
  local_149 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_148,(AssertionResult *)"addr.IsIpv6()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  Address::~Address((Address *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(AddressTest, AddressNegativeTests_InvalidIpv4Address)
{
    Address addr;

    EXPECT_EQ(addr.Set("127.0.0.1.2"), ErrorCode::kInvalidArgs);
    EXPECT_FALSE(addr.IsValid());
    EXPECT_FALSE(addr.IsIpv4());
    EXPECT_FALSE(addr.IsIpv6());
}